

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::StyledStreamWriter::isMultineArray(StyledStreamWriter *this,Value *value)

{
  CommentInfo *pCVar1;
  ArrayIndex AVar2;
  ArrayIndex AVar3;
  Value *pVVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  
  AVar2 = Value::size(value);
  bVar9 = this->rightMargin_ <= AVar2 * 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  if (AVar2 != 0 && !bVar9) {
    uVar7 = 1;
    do {
      pVVar4 = Value::operator[](value,uVar7 - 1);
      if ((*(ushort *)&pVVar4->field_0x8 & 0xfe) == 6) {
        AVar3 = Value::size(pVVar4);
        bVar9 = AVar3 != 0;
      }
      else {
        bVar9 = false;
      }
    } while ((uVar7 < AVar2) && (uVar7 = uVar7 + 1, bVar9 == false));
  }
  if (bVar9 == false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(ulong)AVar2);
    this->field_0x68 = this->field_0x68 | 1;
    uVar7 = AVar2 * 2 + 2;
    bVar5 = 0;
    if (AVar2 != 0) {
      lVar8 = 8;
      uVar6 = 0;
      do {
        pVVar4 = Value::operator[](value,(ArrayIndex)uVar6);
        pCVar1 = pVVar4->comments_;
        if (pCVar1 == (CommentInfo *)0x0) {
          bVar9 = false;
        }
        else {
          bVar9 = pCVar1->comment_ != (char *)0x0;
          if ((!bVar9) && (bVar9 = pCVar1[1].comment_ != (char *)0x0, !bVar9)) {
            bVar9 = pCVar1[2].comment_ != (char *)0x0;
          }
        }
        if (bVar9) {
          bVar5 = 1;
        }
        pVVar4 = Value::operator[](value,(ArrayIndex)uVar6);
        writeValue(this,pVVar4);
        uVar7 = uVar7 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar8);
        uVar6 = uVar6 + 1;
        lVar8 = lVar8 + 0x20;
      } while (AVar2 != uVar6);
    }
    this->field_0x68 = this->field_0x68 & 0xfe;
    bVar9 = (bool)(this->rightMargin_ <= uVar7 | bVar5);
  }
  return bVar9;
}

Assistant:

bool StyledStreamWriter::isMultineArray(const Value& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}